

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-type.hpp
# Opt level: O0

void __thiscall
yactfr::OptionalWithIntegerSelectorType<unsigned_long_long>::OptionalWithIntegerSelectorType
          (OptionalWithIntegerSelectorType<unsigned_long_long> *this,_tKind kind,uint minAlign,
          Up *dt,DataLocation *selLoc,SelectorRangeSet *selRanges,Up *attrs)

{
  SelectorRangeSet *selLoc_00;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> local_38;
  SelectorRangeSet *local_30;
  SelectorRangeSet *selRanges_local;
  DataLocation *selLoc_local;
  Up *dt_local;
  uint minAlign_local;
  _tKind kind_local;
  OptionalWithIntegerSelectorType<unsigned_long_long> *this_local;
  
  local_30 = selRanges;
  selRanges_local = (SelectorRangeSet *)selLoc;
  selLoc_local = (DataLocation *)dt;
  dt_local._0_4_ = minAlign;
  dt_local._4_4_ = kind;
  _minAlign_local = this;
  std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::unique_ptr
            (&local_38,dt);
  selLoc_00 = selRanges_local;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_40,attrs);
  OptionalType::OptionalType
            (&this->super_OptionalType,kind,minAlign,&local_38,(DataLocation *)selLoc_00,&local_40);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::~unique_ptr
            (&local_38);
  (this->super_OptionalType).super_CompoundDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__OptionalWithIntegerSelectorType_007e5f90;
  IntegerRangeSet<unsigned_long_long,_true>::IntegerRangeSet(&this->_selRanges,local_30);
  return;
}

Assistant:

explicit OptionalWithIntegerSelectorType(_tKind kind, unsigned int minAlign, DataType::Up dt,
                                             DataLocation&& selLoc, SelectorRangeSet&& selRanges,
                                             MapItem::Up attrs) :
        OptionalType {kind, minAlign, std::move(dt), std::move(selLoc), std::move(attrs)},
        _selRanges {std::move(selRanges)}
    {
    }